

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5HashWrite
              (Fts5Hash *pHash,i64 iRowid,int iCol,int iPos,char bByte,char *pToken,int nToken)

{
  Fts5HashEntry **ppFVar1;
  Fts5HashEntry *pFVar2;
  bool bVar3;
  u64 nBytes;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_t __n;
  Fts5HashEntry **__s;
  size_t sVar9;
  ulong uVar10;
  Fts5HashEntry *pFVar11;
  Fts5HashEntry *pFVar12;
  long lVar13;
  Fts5HashEntry *pFVar14;
  long lVar15;
  long lVar16;
  Fts5HashEntry *p;
  bool bVar17;
  int local_74;
  ulong local_68;
  int local_60;
  
  bVar17 = pHash->eDetail == 0;
  uVar6 = pHash->nSlot;
  if (nToken < 1) {
    uVar4 = 0xd;
  }
  else {
    lVar13 = (ulong)(uint)nToken + 1;
    uVar4 = 0xd;
    do {
      uVar4 = uVar4 * 8 ^ uVar4 ^ (uint)(byte)pToken[lVar13 + -2];
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  local_68 = (ulong)(uVar4 << 3 ^ (byte)bByte ^ uVar4) % (ulong)uVar6;
  ppFVar1 = pHash->aSlot;
  pFVar11 = ppFVar1[local_68];
  __n = (size_t)nToken;
LAB_001ad0bc:
  if (pFVar11 != (Fts5HashEntry *)0x0) {
    if (((*(char *)&pFVar11[1].pHashNext != bByte) || (pFVar11->nKey != nToken)) ||
       (iVar5 = bcmp((void *)((long)&pFVar11[1].pHashNext + 1),pToken,__n), iVar5 != 0))
    goto LAB_001ad0ec;
    if (pFVar11->nAlloc - pFVar11->nData < 0x16) {
      nBytes = (long)pFVar11->nAlloc * 2;
      iVar5 = sqlite3_initialize();
      if (iVar5 == 0) {
        pFVar12 = (Fts5HashEntry *)sqlite3Realloc(pFVar11,nBytes);
      }
      else {
        pFVar12 = (Fts5HashEntry *)0x0;
      }
      if (pFVar12 != (Fts5HashEntry *)0x0) {
        pFVar12->nAlloc = (int)nBytes;
        pFVar2 = (Fts5HashEntry *)(pHash->aSlot + local_68);
        do {
          pFVar14 = pFVar2;
          pFVar2 = pFVar14->pHashNext;
        } while (pFVar2 != pFVar11);
        pFVar14->pHashNext = pFVar12;
        pFVar11 = pFVar12;
      }
      if (pFVar12 == (Fts5HashEntry *)0x0) {
        return 7;
      }
    }
    iVar5 = -pFVar11->nData;
    goto LAB_001ad38f;
  }
  lVar13 = __n + 1;
  lVar15 = 0xf;
  if (0xf < lVar13) {
    lVar15 = lVar13;
  }
  if (pHash->nEntry * 2 < (int)uVar6) {
LAB_001ad2ab:
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      pFVar11 = (Fts5HashEntry *)sqlite3Malloc(lVar15 + 0x71U);
    }
    else {
      pFVar11 = (Fts5HashEntry *)0x0;
    }
    if (pFVar11 != (Fts5HashEntry *)0x0) {
      pFVar11->nAlloc = 0;
      pFVar11->iSzPoslist = 0;
      pFVar11->nData = 0;
      pFVar11->nKey = 0;
      pFVar11->bDel = '\0';
      pFVar11->bContent = '\0';
      pFVar11->iCol = 0;
      pFVar11->iPos = 0;
      pFVar11->iRowid = 0;
      pFVar11->pHashNext = (Fts5HashEntry *)0x0;
      pFVar11->pScanNext = (Fts5HashEntry *)0x0;
      pFVar11->nAlloc = (int)(lVar15 + 0x71U);
      *(char *)&pFVar11[1].pHashNext = bByte;
      memcpy((void *)((long)&pFVar11[1].pHashNext + 1),pToken,__n);
      pFVar11->nKey = nToken;
      *(undefined1 *)((long)&pFVar11[1].pHashNext + lVar13) = 0;
      pFVar11->nData = nToken + 0x32;
      ppFVar1 = pHash->aSlot;
      pFVar11->pHashNext = ppFVar1[local_68];
      ppFVar1[local_68] = pFVar11;
      pHash->nEntry = pHash->nEntry + 1;
      iVar8 = sqlite3Fts5PutVarint
                        ((uchar *)((long)&pFVar11->pHashNext + (long)(nToken + 0x32)),iRowid);
      iVar8 = iVar8 + pFVar11->nData;
      pFVar11->nData = iVar8;
      pFVar11->iRowid = iRowid;
      pFVar11->iSzPoslist = iVar8;
      iVar5 = pHash->eDetail;
      if (iVar5 != 1) {
        pFVar11->nData = iVar8 + 1;
        pFVar11->iCol = -(ushort)(iVar5 != 0);
      }
      iVar5 = pFVar11->nData;
      bVar3 = true;
      goto LAB_001ad387;
    }
    local_60 = 7;
  }
  else {
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      __s = (Fts5HashEntry **)sqlite3Malloc((long)(int)uVar6 << 4);
    }
    else {
      __s = (Fts5HashEntry **)0x0;
    }
    if (__s == (Fts5HashEntry **)0x0) {
      local_60 = 7;
    }
    else {
      memset(__s,0,(long)(int)uVar6 << 4);
      iVar5 = pHash->nSlot;
      if (0 < (long)iVar5) {
        lVar16 = 0;
        do {
          while (pFVar11 = ppFVar1[lVar16], pFVar11 != (Fts5HashEntry *)0x0) {
            ppFVar1[lVar16] = pFVar11->pHashNext;
            sVar9 = strlen((char *)(pFVar11 + 1));
            if ((int)(uint)sVar9 < 1) {
              uVar4 = 0xd;
            }
            else {
              uVar4 = 0xd;
              uVar10 = (ulong)((uint)sVar9 & 0x7fffffff);
              do {
                uVar4 = uVar4 * 8 ^ uVar4 ^ (uint)*(byte *)((long)&pFVar11->iRowid + uVar10 + 7);
                bVar3 = 1 < (long)uVar10;
                uVar10 = uVar10 - 1;
              } while (bVar3);
            }
            uVar10 = (ulong)uVar4 % (ulong)(uVar6 * 2);
            pFVar11->pHashNext = __s[uVar10];
            __s[uVar10] = pFVar11;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != iVar5);
      }
      sqlite3_free(ppFVar1);
      pHash->nSlot = uVar6 * 2;
      pHash->aSlot = __s;
      local_60 = 0;
    }
    if (__s != (Fts5HashEntry **)0x0) {
      if (nToken < 1) {
        uVar6 = 0xd;
      }
      else {
        lVar16 = (ulong)(uint)nToken + 1;
        uVar6 = 0xd;
        do {
          uVar6 = uVar6 * 8 ^ uVar6 ^ (uint)(byte)pToken[lVar16 + -2];
          lVar16 = lVar16 + -1;
        } while (1 < lVar16);
      }
      local_68 = (ulong)(uVar6 << 3 ^ (byte)bByte ^ uVar6) % (ulong)(uint)pHash->nSlot;
    }
    if (__s != (Fts5HashEntry **)0x0) goto LAB_001ad2ab;
  }
  iVar5 = 0;
  bVar3 = false;
  pFVar11 = (Fts5HashEntry *)0x0;
LAB_001ad387:
  if (bVar3) {
LAB_001ad38f:
    if (pFVar11->iRowid != iRowid) {
      fts5HashAddPoslistSize(pHash,pFVar11,(Fts5HashEntry *)0x0);
      iVar7 = sqlite3Fts5PutVarint
                        ((uchar *)((long)&pFVar11->pHashNext + (long)pFVar11->nData),
                         iRowid - pFVar11->iRowid);
      iVar7 = iVar7 + pFVar11->nData;
      pFVar11->nData = iVar7;
      pFVar11->iRowid = iRowid;
      pFVar11->iSzPoslist = iVar7;
      iVar8 = pHash->eDetail;
      bVar17 = true;
      if (iVar8 != 1) {
        pFVar11->nData = iVar7 + 1;
        pFVar11->iCol = -(ushort)(iVar8 != 0);
        pFVar11->iPos = 0;
      }
    }
    if (iCol < 0) {
      pFVar11->bDel = '\x01';
    }
    else if (pHash->eDetail == 1) {
      pFVar11->bContent = '\x01';
    }
    else {
      local_74 = iPos;
      if (pFVar11->iCol != iCol) {
        if (pHash->eDetail == 0) {
          iVar8 = pFVar11->nData;
          pFVar11->nData = iVar8 + 1;
          *(undefined1 *)((long)&pFVar11->pHashNext + (long)iVar8) = 1;
          iVar8 = sqlite3Fts5PutVarint
                            ((uchar *)((long)&pFVar11->pHashNext + (long)pFVar11->nData),
                             (ulong)(uint)iCol);
          pFVar11->nData = pFVar11->nData + iVar8;
          pFVar11->iCol = (i16)iCol;
          pFVar11->iPos = 0;
        }
        else {
          pFVar11->iCol = (i16)iCol;
          bVar17 = true;
          local_74 = iCol;
        }
      }
      if (bVar17) {
        iVar8 = sqlite3Fts5PutVarint
                          ((uchar *)((long)&pFVar11->pHashNext + (long)pFVar11->nData),
                           (long)((local_74 - pFVar11->iPos) + 2));
        pFVar11->nData = pFVar11->nData + iVar8;
        pFVar11->iPos = local_74;
      }
    }
    *pHash->pnByte = *pHash->pnByte + iVar5 + pFVar11->nData;
    local_60 = 0;
  }
  return local_60;
LAB_001ad0ec:
  pFVar11 = pFVar11->pHashNext;
  goto LAB_001ad0bc;
}

Assistant:

static int sqlite3Fts5HashWrite(
  Fts5Hash *pHash,
  i64 iRowid,                     /* Rowid for this entry */
  int iCol,                       /* Column token appears in (-ve -> delete) */
  int iPos,                       /* Position of token within column */
  char bByte,                     /* First byte of token */
  const char *pToken, int nToken  /* Token to add or remove to or from index */
){
  unsigned int iHash;
  Fts5HashEntry *p;
  u8 *pPtr;
  int nIncr = 0;                  /* Amount to increment (*pHash->pnByte) by */
  int bNew;                       /* If non-delete entry should be written */
  
  bNew = (pHash->eDetail==FTS5_DETAIL_FULL);

  /* Attempt to locate an existing hash entry */
  iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
  for(p=pHash->aSlot[iHash]; p; p=p->pHashNext){
    char *zKey = fts5EntryKey(p);
    if( zKey[0]==bByte 
     && p->nKey==nToken
     && memcmp(&zKey[1], pToken, nToken)==0 
    ){
      break;
    }
  }

  /* If an existing hash entry cannot be found, create a new one. */
  if( p==0 ){
    /* Figure out how much space to allocate */
    char *zKey;
    sqlite3_int64 nByte = sizeof(Fts5HashEntry) + (nToken+1) + 1 + 64;
    if( nByte<128 ) nByte = 128;

    /* Grow the Fts5Hash.aSlot[] array if necessary. */
    if( (pHash->nEntry*2)>=pHash->nSlot ){
      int rc = fts5HashResize(pHash);
      if( rc!=SQLITE_OK ) return rc;
      iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
    }

    /* Allocate new Fts5HashEntry and add it to the hash table. */
    p = (Fts5HashEntry*)sqlite3_malloc64(nByte);
    if( !p ) return SQLITE_NOMEM;
    memset(p, 0, sizeof(Fts5HashEntry));
    p->nAlloc = (int)nByte;
    zKey = fts5EntryKey(p);
    zKey[0] = bByte;
    memcpy(&zKey[1], pToken, nToken);
    assert( iHash==fts5HashKey(pHash->nSlot, (u8*)zKey, nToken+1) );
    p->nKey = nToken;
    zKey[nToken+1] = '\0';
    p->nData = nToken+1 + 1 + sizeof(Fts5HashEntry);
    p->pHashNext = pHash->aSlot[iHash];
    pHash->aSlot[iHash] = p;
    pHash->nEntry++;

    /* Add the first rowid field to the hash-entry */
    p->nData += sqlite3Fts5PutVarint(&((u8*)p)[p->nData], iRowid);
    p->iRowid = iRowid;

    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
    }

    nIncr += p->nData;
  }else{

    /* Appending to an existing hash-entry. Check that there is enough 
    ** space to append the largest possible new entry. Worst case scenario 
    ** is:
    **
    **     + 9 bytes for a new rowid,
    **     + 4 byte reserved for the "poslist size" varint.
    **     + 1 byte for a "new column" byte,
    **     + 3 bytes for a new column number (16-bit max) as a varint,
    **     + 5 bytes for the new position offset (32-bit max).
    */
    if( (p->nAlloc - p->nData) < (9 + 4 + 1 + 3 + 5) ){
      sqlite3_int64 nNew = p->nAlloc * 2;
      Fts5HashEntry *pNew;
      Fts5HashEntry **pp;
      pNew = (Fts5HashEntry*)sqlite3_realloc64(p, nNew);
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->nAlloc = (int)nNew;
      for(pp=&pHash->aSlot[iHash]; *pp!=p; pp=&(*pp)->pHashNext);
      *pp = pNew;
      p = pNew;
    }
    nIncr -= p->nData;
  }
  assert( (p->nAlloc - p->nData) >= (9 + 4 + 1 + 3 + 5) );

  pPtr = (u8*)p;

  /* If this is a new rowid, append the 4-byte size field for the previous
  ** entry, and the new rowid for this entry.  */
  if( iRowid!=p->iRowid ){
    fts5HashAddPoslistSize(pHash, p, 0);
    p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iRowid - p->iRowid);
    p->iRowid = iRowid;
    bNew = 1;
    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
      p->iPos = 0;
    }
  }

  if( iCol>=0 ){
    if( pHash->eDetail==FTS5_DETAIL_NONE ){
      p->bContent = 1;
    }else{
      /* Append a new column value, if necessary */
      assert( iCol>=p->iCol );
      if( iCol!=p->iCol ){
        if( pHash->eDetail==FTS5_DETAIL_FULL ){
          pPtr[p->nData++] = 0x01;
          p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iCol);
          p->iCol = (i16)iCol;
          p->iPos = 0;
        }else{
          bNew = 1;
          p->iCol = (i16)(iPos = iCol);
        }
      }

      /* Append the new position offset, if necessary */
      if( bNew ){
        p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iPos - p->iPos + 2);
        p->iPos = iPos;
      }
    }
  }else{
    /* This is a delete. Set the delete flag. */
    p->bDel = 1;
  }

  nIncr += p->nData;
  *pHash->pnByte += nIncr;
  return SQLITE_OK;
}